

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O3

void anon_unknown.dwarf_273be4::SeedFast(CSHA512 *hasher)

{
  int iVar1;
  long in_FS_OFFSET;
  char cVar2;
  bool bVar3;
  uchar *ptr;
  uint64_t out;
  uchar buffer [32];
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38 [40];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = local_38;
  CSHA512::Write(hasher,(uchar *)&local_48,8);
  if ((anonymous_namespace)::g_rdrand_supported == '\x01') {
    iVar1 = 9;
    do {
      local_40 = rdrand();
      cVar2 = rdrandIsValid();
      bVar3 = iVar1 != 0;
      iVar1 = iVar1 + -1;
      if (cVar2 != '\0') break;
    } while (bVar3);
    CSHA512::Write(hasher,(uchar *)&local_40,8);
  }
  SeedTimestamp(hasher);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SeedFast(CSHA512& hasher) noexcept
{
    unsigned char buffer[32];

    // Stack pointer to indirectly commit to thread/callstack
    const unsigned char* ptr = buffer;
    hasher.Write((const unsigned char*)&ptr, sizeof(ptr));

    // Hardware randomness is very fast when available; use it always.
    SeedHardwareFast(hasher);

    // High-precision timestamp
    SeedTimestamp(hasher);
}